

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O3

string * cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                   (string *__return_storage_ptr__,
                   vector<cmLinkItem,_std::allocator<cmLinkItem>_> *r,char *delimiter)

{
  pointer pcVar1;
  ulong uVar2;
  pointer __value;
  ostringstream os;
  ostream_iterator<cmLinkItem,_char,_std::char_traits<char>_> local_1b8;
  undefined1 local_1a8 [376];
  
  if ((r->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (r->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    __value = (r->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pcVar1 = (r->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar2 = (long)pcVar1 + (-0x28 - (long)__value);
    local_1b8._M_stream = (ostream_type *)local_1a8;
    local_1b8._M_string = delimiter;
    if (0 < (long)uVar2) {
      uVar2 = uVar2 / 0x28 + 1;
      do {
        std::ostream_iterator<cmLinkItem,_char,_std::char_traits<char>_>::operator=
                  (&local_1b8,__value);
        __value = __value + 1;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar1[-1].super_string._M_dataplus._M_p,
               pcVar1[-1].super_string._M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& r, const char* delimiter)
{
  if (r.empty()) {
    return std::string();
  }
  std::ostringstream os;
  typedef typename Range::value_type ValueType;
  typedef typename Range::const_iterator InputIt;
  const InputIt first = r.begin();
  InputIt last = r.end();
  --last;
  std::copy(first, last, std::ostream_iterator<ValueType>(os, delimiter));

  os << *last;

  return os.str();
}